

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vad_core.c
# Opt level: O0

int WebRtcVad_InitCore(VadInstT *self)

{
  int iVar1;
  int local_1c;
  int i;
  VadInstT *self_local;
  
  if (self == (VadInstT *)0x0) {
    self_local._4_4_ = -1;
  }
  else {
    self->vad = 1;
    self->frame_counter = 0;
    self->over_hang = 0;
    self->num_of_speech = 0;
    memset(self->downsampling_filter_states,0,0x10);
    WebRtcSpl_ResetResample48khzTo8khz(&self->state_48_to_8);
    for (local_1c = 0; local_1c < 0xc; local_1c = local_1c + 1) {
      self->noise_means[local_1c] = kNoiseDataMeans[local_1c];
      self->speech_means[local_1c] = kSpeechDataMeans[local_1c];
      self->noise_stds[local_1c] = kNoiseDataStds[local_1c];
      self->speech_stds[local_1c] = kSpeechDataStds[local_1c];
    }
    for (local_1c = 0; local_1c < 0x60; local_1c = local_1c + 1) {
      self->low_value_vector[local_1c] = 10000;
      self->index_vector[local_1c] = 0;
    }
    memset(self->upper_state,0,10);
    memset(self->lower_state,0,10);
    memset(self->hp_filter_state,0,8);
    for (local_1c = 0; local_1c < 6; local_1c = local_1c + 1) {
      self->mean_value[local_1c] = 0x640;
    }
    iVar1 = WebRtcVad_set_mode_core(self,0);
    if (iVar1 == 0) {
      self->init_flag = 0x2a;
      self_local._4_4_ = 0;
    }
    else {
      self_local._4_4_ = -1;
    }
  }
  return self_local._4_4_;
}

Assistant:

int WebRtcVad_InitCore(VadInstT* self) {
  int i;

  if (self == NULL) {
    return -1;
  }

  // Initialization of general struct variables.
  self->vad = 1;  // Speech active (=1).
  self->frame_counter = 0;
  self->over_hang = 0;
  self->num_of_speech = 0;

  // Initialization of downsampling filter state.
  memset(self->downsampling_filter_states, 0,
         sizeof(self->downsampling_filter_states));

  // Initialization of 48 to 8 kHz downsampling.
  WebRtcSpl_ResetResample48khzTo8khz(&self->state_48_to_8);

  // Read initial PDF parameters.
  for (i = 0; i < kTableSize; i++) {
    self->noise_means[i] = kNoiseDataMeans[i];
    self->speech_means[i] = kSpeechDataMeans[i];
    self->noise_stds[i] = kNoiseDataStds[i];
    self->speech_stds[i] = kSpeechDataStds[i];
  }

  // Initialize Index and Minimum value vectors.
  for (i = 0; i < 16 * kNumChannels; i++) {
    self->low_value_vector[i] = 10000;
    self->index_vector[i] = 0;
  }

  // Initialize splitting filter states.
  memset(self->upper_state, 0, sizeof(self->upper_state));
  memset(self->lower_state, 0, sizeof(self->lower_state));

  // Initialize high pass filter states.
  memset(self->hp_filter_state, 0, sizeof(self->hp_filter_state));

  // Initialize mean value memory, for WebRtcVad_FindMinimum().
  for (i = 0; i < kNumChannels; i++) {
    self->mean_value[i] = 1600;
  }

  // Set aggressiveness mode to default (=|kDefaultMode|).
  if (WebRtcVad_set_mode_core(self, kDefaultMode) != 0) {
    return -1;
  }

  self->init_flag = kInitCheck;

  return 0;
}